

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O3

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  int iVar1;
  Model *this_00;
  pointer pbVar2;
  pointer pcVar3;
  ulong uVar4;
  Rep *pRVar5;
  OneHotEncoder *this_01;
  StringVector *pSVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar7;
  Arena *pAVar8;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] == 600) {
    this_01 = (this_00->Type_).onehotencoder_;
  }
  else {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 600;
    uVar4 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::OneHotEncoder>
                        (pAVar8);
    (this_00->Type_).onehotencoder_ = this_01;
  }
  Specification::OneHotEncoder::clear_stringcategories(this_01);
  pbVar9 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 != pbVar2) {
    do {
      pcVar3 = (pbVar9->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + pbVar9->_M_string_length);
      if (this_01->_oneof_case_[0] == 1) {
        pSVar6 = (this_01->CategoryType_).stringcategories_;
      }
      else {
        Specification::OneHotEncoder::clear_CategoryType(this_01);
        this_01->_oneof_case_[0] = 1;
        uVar4 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
        pAVar8 = (Arena *)(uVar4 & 0xfffffffffffffffc);
        if ((uVar4 & 1) != 0) {
          pAVar8 = *(Arena **)pAVar8;
        }
        pSVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                           (pAVar8);
        (this_01->CategoryType_).stringcategories_ = pSVar6;
      }
      pRVar5 = (pSVar6->vector_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_002e3747:
        obj = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pSVar6->vector_).super_RepeatedPtrFieldBase.arena_);
        psVar7 = (string *)
                 google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(pSVar6->vector_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar1 = (pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar1) goto LAB_002e3747;
        (pSVar6->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar7 = (string *)pRVar5->elements[iVar1];
      }
      std::__cxx11::string::_M_assign(psVar7);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar2);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<std::string>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_stringcategories();
        
        for (auto element : container) {
            std::string *value = ohe->mutable_stringcategories()->add_vector();
            *value = element;
        }
        return Result();
    }